

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *__dest;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  iVar2 = (this->Buf).Size;
  uVar6 = (int)sz + 7U & 0xfffffffc;
  iVar7 = iVar2 + uVar6;
  iVar3 = (this->Buf).Capacity;
  if (iVar3 < iVar7) {
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar8 <= iVar7) {
      iVar8 = iVar7;
    }
    if (iVar3 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar8,GImAllocatorUserData);
      pcVar4 = (this->Buf).Data;
      if (pcVar4 != (char *)0x0) {
        memcpy(__dest,pcVar4,(long)(this->Buf).Size);
        pcVar4 = (this->Buf).Data;
        if ((pcVar4 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar8;
    }
  }
  (this->Buf).Size = iVar7;
  puVar5 = (uint *)((this->Buf).Data + iVar2);
  *puVar5 = uVar6;
  return (ImGuiWindowSettings *)(puVar5 + 1);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }